

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O1

uint GetNextFuzzyBits(uchar *buffer,uint offset_begin,uint offset_end,bool bSearchForFuzzy)

{
  ulong uVar1;
  
  if (offset_begin < offset_end) {
    uVar1 = (ulong)offset_begin;
    do {
      if (bSearchForFuzzy) {
        if ((buffer[uVar1] & 4) != 0) {
LAB_0014b1b6:
          return (uint)uVar1;
        }
      }
      else if ((buffer[uVar1] & 4) == 0) goto LAB_0014b1b6;
      uVar1 = uVar1 + 1;
    } while (offset_end != uVar1);
  }
  return 0xffffffff;
}

Assistant:

unsigned int GetNextFuzzyBits(unsigned char* buffer, unsigned int offset_begin, unsigned int offset_end,
                              bool bSearchForFuzzy)
{
   //
   while (offset_begin < offset_end)
   {
      if (bSearchForFuzzy)
      {
         if (buffer[offset_begin] & BIT_WEAK)
         {
            // Found !
            return offset_begin;
         }
      }
      else
      {
         if ((buffer[offset_begin] & BIT_WEAK) == 0)
         {
            // Found !
            return offset_begin;
         }
      }

      offset_begin++;
   }
   return -1;
}